

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int cipher_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key,EVP_CIPHER *cipher,
                       _func_void_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *do_transform)

{
  int iVar1;
  EVP_CIPHER_CTX *pEVar2;
  EVP_CIPHER *in_RCX;
  uchar *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  cipher_context_t *ctx;
  
  *(code **)(in_RDI + 8) = cipher_dispose;
  *(code **)(in_RDI + 0x10) = cipher_do_init;
  *(undefined8 *)(in_RDI + 0x18) = in_R8;
  pEVar2 = EVP_CIPHER_CTX_new();
  *(EVP_CIPHER_CTX **)(in_RDI + 0x20) = pEVar2;
  if (pEVar2 == (EVP_CIPHER_CTX *)0x0) {
    return 0x201;
  }
  if (in_ESI == 0) {
    iVar1 = EVP_DecryptInit_ex(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),in_RCX,(ENGINE *)0x0,in_RDX,
                               (uchar *)0x0);
    if (iVar1 != 0) {
      EVP_CIPHER_CTX_set_padding(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),0);
      return 0;
    }
  }
  else {
    iVar1 = EVP_EncryptInit_ex(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),in_RCX,(ENGINE *)0x0,in_RDX,
                               (uchar *)0x0);
    if (iVar1 != 0) {
      return 0;
    }
  }
  EVP_CIPHER_CTX_free(*(EVP_CIPHER_CTX **)(in_RDI + 0x20));
  return 0x203;
}

Assistant:

static int cipher_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key, const EVP_CIPHER *cipher,
                               void (*do_transform)(ptls_cipher_context_t *, void *, const void *, size_t))
{
    struct cipher_context_t *ctx = (struct cipher_context_t *)_ctx;

    ctx->super.do_dispose = cipher_dispose;
    ctx->super.do_init = cipher_do_init;
    ctx->super.do_transform = do_transform;

    if ((ctx->evp = EVP_CIPHER_CTX_new()) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (is_enc) {
        if (!EVP_EncryptInit_ex(ctx->evp, cipher, NULL, key, NULL))
            goto Error;
    } else {
        if (!EVP_DecryptInit_ex(ctx->evp, cipher, NULL, key, NULL))
            goto Error;
        EVP_CIPHER_CTX_set_padding(ctx->evp, 0); /* required to disable one block buffering in ECB mode */
    }

    return 0;
Error:
    EVP_CIPHER_CTX_free(ctx->evp);
    return PTLS_ERROR_LIBRARY;
}